

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruapu.h
# Opt level: O0

int ruapu_supports(char *isa)

{
  int iVar1;
  char *in_RDI;
  char **isa_supported;
  char **local_18;
  
  local_18 = g_ruapu_isa_supported;
  while( true ) {
    if (*local_18 == (char *)0x0) {
      return 0;
    }
    iVar1 = strcmp(*local_18,in_RDI);
    if (iVar1 == 0) break;
    local_18 = local_18 + 1;
  }
  return 1;
}

Assistant:

int ruapu_supports(const char* isa)
{
    const char* const* isa_supported = g_ruapu_isa_supported;
    while (*isa_supported)
    {
        if (strcmp(*isa_supported, isa) == 0)
            return 1;

        isa_supported++;
    }

    return 0;
}